

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

void __thiscall FArchive::WriteSprite(FArchive *this,int spritenum)

{
  size_t sVar1;
  DWORD count;
  BYTE id;
  
  count = 0;
  if ((uint)spritenum < sprites.Count) {
    count = spritenum;
  }
  if (this->m_SpriteMap[(int)count] < 0) {
    sVar1 = this->m_NumSprites;
    this->m_NumSprites = sVar1 + 1;
    this->m_SpriteMap[(int)count] = (int)sVar1;
    (*this->_vptr_FArchive[2])(this,&id,1);
    (*this->_vptr_FArchive[2])(this,sprites.Array + (int)count,4);
  }
  else {
    (*this->_vptr_FArchive[2])(this,&id,1);
    count = this->m_SpriteMap[(int)count];
  }
  WriteCount(this,count);
  return;
}

Assistant:

void FCompressedFile::Explode ()
{
	uLong expandsize, cprlen;
	unsigned char *expand;

	if (m_Buffer)
	{
		unsigned int *ints = (unsigned int *)(m_Buffer);
		cprlen = BigLong(ints[0]);
		expandsize = BigLong(ints[1]);
		
		expand = (unsigned char *)M_Malloc (expandsize);
		if (cprlen)
		{
			int r;
			uLong newlen;

			newlen = expandsize;
			r = uncompress (expand, &newlen, m_Buffer + 8, cprlen);
			if (r != Z_OK || newlen != expandsize)
			{
				M_Free (expand);
				I_Error ("Could not decompress buffer: %s", M_ZLibError(r).GetChars());
			}
		}
		else
		{
			memcpy (expand, m_Buffer + 8, expandsize);
		}
		if (FreeOnExplode ())
			M_Free (m_Buffer);
		m_Buffer = expand;
		m_BufferSize = expandsize;
	}
}